

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QWidget * QApplication::widgetAt(QPoint *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QWidget *pQVar6;
  ulong uVar7;
  QWidget *pQVar8;
  long in_FS_OFFSET;
  QWidget *recurse;
  int y;
  int x;
  QWidget *child;
  QWidget *window;
  QRegion newmask;
  QPoint wpoint;
  QRegion oldmask;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QWidget *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QWidget *in_stack_ffffffffffffff70;
  QWidget *in_stack_ffffffffffffff78;
  QWidget *local_80;
  QWidget *this;
  QWidget *local_58;
  QRegion local_50;
  QRect local_48;
  QRegion local_38;
  QRegion local_30 [2];
  QPoint local_20;
  QRegion local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = topLevelAt((QPoint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (pQVar6 == (QWidget *)0x0) {
    local_58 = (QWidget *)0x0;
  }
  else {
    this = (QWidget *)0x0;
    bVar1 = QWidget::testAttribute
                      ((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    if (!bVar1) {
      in_stack_ffffffffffffff78 = pQVar6;
      local_10 = QWidget::mapFromGlobal
                           (in_stack_ffffffffffffff70,
                            (QPoint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
      ;
      this = QWidget::childAt(in_stack_ffffffffffffff78,(QPoint *)in_stack_ffffffffffffff70);
    }
    local_58 = this;
    if ((this == (QWidget *)0x0) &&
       (bVar1 = QWidget::testAttribute
                          ((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20)),
       local_58 = pQVar6, bVar1)) {
      iVar2 = QPoint::x((QPoint *)0x2ca9f3);
      iVar3 = QPoint::y((QPoint *)0x2caa01);
      local_18.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QWidget::mask((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_20 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      pQVar8 = pQVar6;
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     in_stack_ffffffffffffff58);
      local_20 = QWidget::mapFromGlobal
                           (pQVar8,(QPoint *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_30[0].d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      uVar7 = QRegion::isEmpty();
      if ((uVar7 & 1) == 0) {
        QRegion::QRegion(&local_38,(QRegion *)&local_18);
      }
      else {
        local_48 = QWidget::rect(in_stack_ffffffffffffff78);
        QRegion::QRegion(&local_38,(QRect *)&local_48,Rectangle);
      }
      iVar4 = QPoint::x((QPoint *)0x2caad3);
      iVar5 = QPoint::y((QPoint *)0x2caae4);
      QRegion::QRegion(&local_50,iVar4,iVar5,1,1,Rectangle);
      QRegion::operator-(local_30,(QRegion *)&local_38);
      QRegion::~QRegion(&local_50);
      QRegion::~QRegion(&local_38);
      QWidget::setMask(this,(QRegion *)CONCAT44(iVar2,iVar3));
      local_80 = (QWidget *)0x0;
      pQVar8 = topLevelAt((QPoint *)CONCAT44(iVar4,in_stack_ffffffffffffff68));
      if (pQVar8 != pQVar6) {
        local_80 = widgetAt((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (int)in_stack_ffffffffffffff60);
      }
      uVar7 = QRegion::isEmpty();
      if ((uVar7 & 1) == 0) {
        QWidget::setMask(this,(QRegion *)CONCAT44(iVar2,iVar3));
      }
      else {
        QWidget::clearMask(in_stack_ffffffffffffff60);
      }
      local_58 = local_80;
      QRegion::~QRegion(local_30);
      QRegion::~QRegion(&local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

QWidget *QApplication::widgetAt(const QPoint &p)
{
    QWidget *window = QApplication::topLevelAt(p);
    if (!window)
        return nullptr;

    QWidget *child = nullptr;

    if (!window->testAttribute(Qt::WA_TransparentForMouseEvents))
        child = window->childAt(window->mapFromGlobal(p));

    if (child)
        return child;

    if (window->testAttribute(Qt::WA_TransparentForMouseEvents)) {
        //shoot a hole in the widget and try once again,
        //suboptimal on Qt for Embedded Linux where we do
        //know the stacking order of the toplevels.
        int x = p.x();
        int y = p.y();
        QRegion oldmask = window->mask();
        QPoint wpoint = window->mapFromGlobal(QPoint(x, y));
        QRegion newmask = (oldmask.isEmpty() ? QRegion(window->rect()) : oldmask)
                          - QRegion(wpoint.x(), wpoint.y(), 1, 1);
        window->setMask(newmask);
        QWidget *recurse = nullptr;
        if (QApplication::topLevelAt(p) != window) // verify recursion will terminate
            recurse = widgetAt(x, y);
        if (oldmask.isEmpty())
            window->clearMask();
        else
            window->setMask(oldmask);
        return recurse;
    }
    return window;
}